

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O2

FormatDescriptor *
ktx::createFormatDescriptor(FormatDescriptor *__return_storage_ptr__,uint32_t *dfd)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  reference pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t i;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  basicDescriptor basic;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> samples;
  _Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> local_48;
  
  uVar2 = dfd[4];
  basic._0_8_ = (ulong)(uVar2 >> 0x18) << 0x38 |
                (ulong)(uVar2 >> 0x10 & 0xff) << 0x30 |
                (ulong)(uVar2 >> 8 & 0xff) << 0x28 | *(ulong *)(dfd + 3) & 0xffffffffff;
  uVar2 = dfd[6];
  uVar4 = *(ulong *)(dfd + 5);
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar16 = 9;
  for (uVar15 = 0; uVar15 < (dfd[2] >> 0x12) - 6 >> 2; uVar15 = uVar15 + 1) {
    pvVar6 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
             emplace_back<>(&samples);
    uVar5 = dfd[lVar16 + -2];
    uVar10 = CONCAT62((int6)((ulong)*(undefined8 *)pvVar6 >> 0x10),(short)uVar5);
    *(ulong *)pvVar6 = uVar10;
    bVar1 = *(byte *)((long)dfd + lVar16 * 4 + -6);
    uVar7 = (ulong)bVar1 << 0x10;
    *(ulong *)pvVar6 = uVar10 & 0xffffffffff00ffff | uVar7;
    uVar8 = (ulong)(dfd[lVar16 + -2] & 0xf000000);
    *(ulong *)pvVar6 = uVar10 & 0xfffffffff000ffff | uVar7 | uVar8;
    uVar3 = dfd[lVar16 + -2];
    uVar17 = (ulong)(uVar3 & 0x80000000);
    uVar18 = (ulong)(uVar3 & 0x40000000);
    uVar11 = (ulong)(uVar3 & 0x20000000);
    uVar9 = (ulong)(uVar3 & 0x10000000);
    *(ulong *)pvVar6 =
         uVar9 | uVar11 | uVar18 | uVar10 & 0xffffffff0000ffff | uVar7 | uVar8 | uVar17;
    uVar12 = (ulong)(byte)dfd[lVar16 + -1] << 0x20;
    *(ulong *)pvVar6 =
         uVar9 | uVar11 | uVar18 | uVar10 & 0xffffff000000ffff | uVar7 | uVar8 | uVar17 | uVar12;
    uVar13 = (ulong)*(byte *)((long)dfd + lVar16 * 4 + -3) << 0x28;
    *(ulong *)pvVar6 =
         uVar9 | uVar11 | uVar18 | uVar10 & 0xffff00000000ffff | uVar7 | uVar8 | uVar17 | uVar12 |
         uVar13;
    uVar14 = (ulong)*(byte *)((long)dfd + lVar16 * 4 + -2) << 0x30;
    *(ulong *)pvVar6 =
         uVar9 | uVar11 | uVar18 | uVar10 & 0xff0000000000ffff | uVar7 | uVar8 | uVar17 | uVar12 |
         uVar13 | uVar14;
    *(ulong *)pvVar6 =
         uVar9 | uVar11 | uVar18 | CONCAT12(bVar1,(short)uVar5) | uVar8 | uVar17 | uVar12 | uVar13 |
         uVar14 | (ulong)*(byte *)((long)dfd + lVar16 * 4 + -1) << 0x38;
    pvVar6->lower = dfd[(ulong)((uint)lVar16 - 1 & 0xfffffffc) + 1];
    pvVar6->upper = dfd[(ulong)((uint)lVar16 & 0xfffffffd) + 1];
    lVar16 = lVar16 + 4;
  }
  local_48._M_impl.super__Vector_impl_data._M_start =
       samples.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       samples.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       samples.
       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  samples.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic._8_8_ = (ulong)(uVar2 >> 0x18) << 0x38 |
                (ulong)(uVar2 >> 0x10 & 0xff) << 0x30 |
                (ulong)(uVar2 >> 8 & 0xff) << 0x28 | uVar4 & 0xffffffffff;
  FormatDescriptor::FormatDescriptor
            (__return_storage_ptr__,basic,
             (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
             &local_48);
  std::_Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
  ~_Vector_base(&local_48);
  std::_Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
  ~_Vector_base(&samples.
                 super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
               );
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(const uint32_t* dfd) {
    const auto* bdfd = dfd + 1;

    FormatDescriptor::basicDescriptor basic;
    basic.colorModel = khr_df_model_e(KHR_DFDVAL(bdfd, MODEL));
    basic.colorPrimaries = khr_df_primaries_e(KHR_DFDVAL(bdfd, PRIMARIES));
    basic.transferFunction = khr_df_transfer_e(KHR_DFDVAL(bdfd, TRANSFER));
    basic.dataFlags = khr_df_flags_e(KHR_DFDVAL(bdfd, FLAGS));
    basic.texelBlockDimension0 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION0);
    basic.texelBlockDimension1 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION1);
    basic.texelBlockDimension2 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION2);
    basic.texelBlockDimension3 = KHR_DFDVAL(bdfd, TEXELBLOCKDIMENSION3);
    basic.bytesPlane0 = KHR_DFDVAL(bdfd, BYTESPLANE0);
    basic.bytesPlane1 = KHR_DFDVAL(bdfd, BYTESPLANE1);
    basic.bytesPlane2 = KHR_DFDVAL(bdfd, BYTESPLANE2);
    basic.bytesPlane3 = KHR_DFDVAL(bdfd, BYTESPLANE3);
    basic.bytesPlane4 = KHR_DFDVAL(bdfd, BYTESPLANE4);
    basic.bytesPlane5 = KHR_DFDVAL(bdfd, BYTESPLANE5);
    basic.bytesPlane6 = KHR_DFDVAL(bdfd, BYTESPLANE6);
    basic.bytesPlane7 = KHR_DFDVAL(bdfd, BYTESPLANE7);

    std::vector<FormatDescriptor::sample> samples;
    for (uint32_t i = 0; i < KHR_DFDSAMPLECOUNT(bdfd); ++i) {
        auto& sample = samples.emplace_back();
        sample.bitOffset = KHR_DFDSVAL(bdfd, i, BITOFFSET);
        sample.bitLength = KHR_DFDSVAL(bdfd, i, BITLENGTH);
        sample.channelType = KHR_DFDSVAL(bdfd, i, CHANNELID);
        const auto dataType = KHR_DFDSVAL(bdfd, i, QUALIFIERS);
        sample.qualifierFloat = (dataType & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;
        sample.qualifierSigned = (dataType & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        sample.qualifierExponent = (dataType & KHR_DF_SAMPLE_DATATYPE_EXPONENT) != 0;
        sample.qualifierLinear = (dataType & KHR_DF_SAMPLE_DATATYPE_LINEAR) != 0;
        sample.samplePosition0 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION0);
        sample.samplePosition1 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION1);
        sample.samplePosition2 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION2);
        sample.samplePosition3 = KHR_DFDSVAL(bdfd, i, SAMPLEPOSITION3);
        sample.lower = KHR_DFDSVAL(bdfd, i, SAMPLELOWER);
        sample.upper = KHR_DFDSVAL(bdfd, i, SAMPLEUPPER);
    }

    return FormatDescriptor{basic, std::move(samples)};
}